

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O1

Accel * __thiscall
embree::BVH8Factory::BVH8GridMB
          (BVH8Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  long lVar1;
  int iVar2;
  BVHN<8> *this_00;
  Builder *pBVar3;
  Accel *pAVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  Intersectors intersectors;
  long *local_188;
  long local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  BVHN<8> *local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  Intersector1 local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  
  this_00 = (BVHN<8> *)alignedMalloc(0x240,0x10);
  BVHN<8>::BVHN(this_00,(PrimitiveType *)&SubGridQBVHN<8>::type,scene);
  local_128.intersect = (IntersectFunc)0x0;
  local_128.occluded = (OccludedFunc)0x0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = (BVHN<8> *)0x0;
  uStack_140 = 0;
  memset(&local_128.name,0,0xe0);
  local_148 = this_00;
  (*this->BVH8GridMBIntersector1Moeller)(&local_128);
  local_f8 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  iVar2 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x440));
  if (iVar2 == 0) {
    pBVar3 = (*this->BVH8GridMBSceneBuilderSAH)(this_00,scene,0);
    pAVar4 = (Accel *)alignedMalloc(0x180,0x10);
    (pAVar4->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
         0x7f8000007f800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
         0xff800000ff800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
         0x7f8000007f800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
         0xff800000ff800000;
    (pAVar4->super_AccelData).type = TY_ACCEL_INSTANCE;
    (pAVar4->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
    memcpy(&(pAVar4->super_AccelData).field_0x58,&local_148,0x118);
    (pAVar4->super_AccelData).super_RefCount._vptr_RefCount =
         (_func_int **)&PTR__AccelInstance_02207a80;
    pAVar4[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)this_00;
    pAVar4[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
         (__int_type_conflict)pBVar3;
    return pAVar4;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::operator+(&local_168,"unknown builder ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
  local_188 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_188 == plVar7) {
    local_178 = *plVar7;
    uStack_170 = (undefined4)plVar6[3];
    uStack_16c = *(undefined4 *)((long)plVar6 + 0x1c);
    local_188 = &local_178;
  }
  else {
    local_178 = *plVar7;
  }
  lVar1 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  *puVar5 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar5 + 1) = 2;
  puVar5[2] = puVar5 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar5 + 2),local_188,lVar1 + (long)local_188);
  __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

Accel* BVH8Factory::BVH8GridMB(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH8* accel = new BVH8(SubGridQBVH8::type,scene);
    Accel::Intersectors intersectors = BVH8GridMBIntersectors(accel,ivariant);
    Builder* builder = nullptr;
    if (scene->device->grid_builder_mb == "default") {
      builder = BVH8GridMBSceneBuilderSAH(accel,scene,0);
    }
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->object_builder+" for BVH8MB<GridMesh>");
    return new AccelInstance(accel,builder,intersectors);        
  }